

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void deqp::gls::RandomArrayGenerator::setData
               (char *data,InputType type,deRandom *rnd,GLValue min,GLValue max)

{
  InputType min_00;
  char val;
  uchar val_00;
  short val_01;
  unsigned_short val_02;
  deFloat16 val_03;
  deInt32 val_04;
  int val_05;
  uint val_06;
  anon_union_8_10_1f5805e9_for_GLValue_1 aVar1;
  float fVar2;
  Half local_82;
  float local_80;
  InputType local_7c;
  uint local_78;
  float local_74;
  InputType local_70;
  int local_6c;
  float local_68;
  InputType local_64;
  Fixed local_60;
  char local_5a;
  undefined1 local_59;
  WrappedType local_58;
  char local_57;
  undefined1 local_56;
  WrappedType local_55;
  short local_54;
  undefined2 local_52;
  unsigned_short local_50;
  short local_4e;
  undefined2 local_4c;
  short local_4a;
  float local_48;
  InputType local_44;
  float local_40;
  float local_3c;
  InputType local_38;
  float local_34;
  deRandom *local_30;
  deRandom *rnd_local;
  char *pcStack_20;
  InputType type_local;
  char *data_local;
  GLValue min_local;
  
  aVar1 = min.field_1;
  data_local._0_4_ = min.type;
  min_local.type._0_1_ = min.field_1._0_1_;
  local_59 = (undefined1)min_local.type;
  min_local.type._0_2_ = min.field_1._0_2_;
  local_52 = (undefined2)min_local.type;
  min_local.type = min.field_1._0_4_;
  min_00 = min_local.type;
  local_5a = (char)max.field_1.b.m_value;
  local_54 = (short)max.field_1.s.m_value;
  local_30 = rnd;
  rnd_local._4_4_ = type;
  pcStack_20 = data;
  min_local._0_8_ = aVar1;
  switch(type) {
  case INPUTTYPE_FLOAT:
    local_38 = min_local.type;
    local_3c = (float)max.field_1.fl.m_value;
    local_34 = (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                                (rnd,(Float)min_00,max.field_1.fl.m_value);
    fVar2 = gls::GLValue::WrappedFloatType::operator_cast_to_float((WrappedFloatType *)&local_34);
    alignmentSafeAssignment<float>(data,fVar2);
    break;
  case INPUTTYPE_FIXED:
    local_64 = min_local.type;
    local_68 = (float)max.field_1.fl.m_value;
    local_60 = getRandom<deqp::gls::GLValue::Fixed>(rnd,(Fixed)min_00,max.field_1.fi.m_value);
    val_04 = gls::GLValue::Fixed::operator_cast_to_int(&local_60);
    alignmentSafeAssignment<int>(data,val_04);
    break;
  case INPUTTYPE_DOUBLE:
    local_44 = min_local.type;
    local_48 = (float)max.field_1.fl.m_value;
    local_40 = (float)getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                                (rnd,(Float)min_00,max.field_1.fl.m_value);
    fVar2 = gls::GLValue::WrappedFloatType::operator_cast_to_float((WrappedFloatType *)&local_40);
    alignmentSafeAssignment<double>(data,(double)fVar2);
    break;
  case INPUTTYPE_BYTE:
    local_56 = local_59;
    local_57 = local_5a;
    local_55 = (WrappedType)
               getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                         (rnd,(Byte)local_59,(Byte)local_5a);
    val = gls::GLValue::WrappedType::operator_cast_to_signed_char(&local_55);
    alignmentSafeAssignment<signed_char>(data,val);
    break;
  case INPUTTYPE_SHORT:
    local_4c = local_52;
    local_4e = local_54;
    local_4a = (short)getRandom<deqp::gls::GLValue::WrappedType<short>>
                                (rnd,(Short)local_52,(Short)local_54);
    val_01 = gls::GLValue::WrappedType::operator_cast_to_short((WrappedType *)&local_4a);
    alignmentSafeAssignment<short>(data,val_01);
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    local_58 = (WrappedType)
               getRandom<deqp::gls::GLValue::WrappedType<unsigned_char>>
                         (rnd,(Ubyte)local_59,(Ubyte)local_5a);
    val_00 = gls::GLValue::WrappedType::operator_cast_to_unsigned_char(&local_58);
    alignmentSafeAssignment<unsigned_char>(data,val_00);
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    local_50 = (unsigned_short)
               getRandom<deqp::gls::GLValue::WrappedType<unsigned_short>>
                         (rnd,(Ushort)local_52,(Ushort)local_54);
    val_02 = gls::GLValue::WrappedType::operator_cast_to_unsigned_short((WrappedType *)&local_50);
    alignmentSafeAssignment<unsigned_short>(data,val_02);
    break;
  case INPUTTYPE_INT:
    local_70 = min_local.type;
    local_74 = (float)max.field_1.fl.m_value;
    local_6c = (int)getRandom<deqp::gls::GLValue::WrappedType<int>>
                              (rnd,(Int)min_00,max.field_1.i.m_value);
    val_05 = gls::GLValue::WrappedType::operator_cast_to_int((WrappedType *)&local_6c);
    alignmentSafeAssignment<int>(data,val_05);
    break;
  case INPUTTYPE_UNSIGNED_INT:
    local_7c = min_local.type;
    local_80 = (float)max.field_1.fl.m_value;
    local_78 = (uint)getRandom<deqp::gls::GLValue::WrappedType<unsigned_int>>
                               (rnd,(Uint)min_00,max.field_1.ui.m_value);
    val_06 = gls::GLValue::WrappedType::operator_cast_to_unsigned_int((WrappedType *)&local_78);
    alignmentSafeAssignment<unsigned_int>(data,val_06);
    break;
  case INPUTTYPE_HALF:
    local_82 = getRandom<deqp::gls::GLValue::Half>(rnd,(Half)local_52,(Half)local_54);
    val_03 = gls::GLValue::Half::getValue(&local_82);
    alignmentSafeAssignment<unsigned_short>(data,val_03);
  }
  return;
}

Assistant:

void RandomArrayGenerator::setData (char* data, Array::InputType type, deRandom& rnd, GLValue min, GLValue max)
{
	switch (type)
	{
		case Array::INPUTTYPE_FLOAT:
		{
			alignmentSafeAssignment<float>(data, getRandom<GLValue::Float>(rnd, min.fl, max.fl));
			break;
		}

		case Array::INPUTTYPE_DOUBLE:
		{
			alignmentSafeAssignment<double>(data, getRandom<GLValue::Float>(rnd, min.fl, max.fl));
			break;
		}

		case Array::INPUTTYPE_SHORT:
		{
			alignmentSafeAssignment<deInt16>(data, getRandom<GLValue::Short>(rnd, min.s, max.s));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_SHORT:
		{
			alignmentSafeAssignment<deUint16>(data, getRandom<GLValue::Ushort>(rnd, min.us, max.us));
			break;
		}

		case Array::INPUTTYPE_BYTE:
		{
			alignmentSafeAssignment<deInt8>(data, getRandom<GLValue::Byte>(rnd, min.b, max.b));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_BYTE:
		{
			alignmentSafeAssignment<deUint8>(data, getRandom<GLValue::Ubyte>(rnd, min.ub, max.ub));
			break;
		}

		case Array::INPUTTYPE_FIXED:
		{
			alignmentSafeAssignment<deInt32>(data, getRandom<GLValue::Fixed>(rnd, min.fi, max.fi));
			break;
		}

		case Array::INPUTTYPE_INT:
		{
			alignmentSafeAssignment<deInt32>(data, getRandom<GLValue::Int>(rnd, min.i, max.i));
			break;
		}

		case Array::INPUTTYPE_UNSIGNED_INT:
		{
			alignmentSafeAssignment<deUint32>(data, getRandom<GLValue::Uint>(rnd, min.ui, max.ui));
			break;
		}

		case Array::INPUTTYPE_HALF:
		{
			alignmentSafeAssignment<deFloat16>(data, getRandom<GLValue::Half>(rnd, min.h, max.h).getValue());
			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}
}